

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall
HModel::util_reportColVecSol
          (HModel *this,int ncol,vector<double,_std::allocator<double>_> *XcolCost,
          vector<double,_std::allocator<double>_> *XcolLower,
          vector<double,_std::allocator<double>_> *XcolUpper,
          vector<double,_std::allocator<double>_> *XcolPrimal,
          vector<double,_std::allocator<double>_> *XcolDual,
          vector<int,_std::allocator<int>_> *XcolStatus)

{
  double dVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  reference pvVar6;
  reference pvVar7;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  int in_ESI;
  vector<double,_std::allocator<double>_> *in_R8;
  vector<double,_std::allocator<double>_> *in_R9;
  vector<double,_std::allocator<double>_> *in_stack_00000008;
  vector<int,_std::allocator<int>_> *in_stack_00000010;
  int col;
  uint local_34;
  
  if (0 < in_ESI) {
    printf("Col    St      Primal       Lower       Upper        Dual        Cost\n");
    for (local_34 = 0; (int)local_34 < in_ESI; local_34 = local_34 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (in_stack_00000010,(long)(int)local_34);
      if (*pvVar6 == 1) {
        printf("%6d BC",(ulong)local_34);
      }
      else {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (in_stack_00000010,(long)(int)local_34);
        if (*pvVar6 == 3) {
          printf("%6d FR",(ulong)local_34);
        }
        else {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (in_stack_00000010,(long)(int)local_34);
          if (*pvVar6 == 0) {
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               (in_RCX,(long)(int)local_34);
            dVar1 = *pvVar7;
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               (in_R8,(long)(int)local_34);
            if ((dVar1 != *pvVar7) || (NAN(dVar1) || NAN(*pvVar7))) {
              printf("%6d LB",(ulong)local_34);
            }
            else {
              printf("%6d FX",(ulong)local_34);
            }
          }
          else {
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               (in_stack_00000010,(long)(int)local_34);
            if (*pvVar6 == 2) {
              printf("%6d UB",(ulong)local_34);
            }
            else {
              printf("%6d ??",(ulong)local_34);
            }
          }
        }
      }
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_R9,(long)(int)local_34);
      vVar2 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)(int)local_34);
      vVar3 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,(long)(int)local_34);
      vVar4 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_00000008,(long)(int)local_34);
      vVar5 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)(int)local_34);
      printf(" %11g %11g %11g %11g %11g\n",vVar2,vVar3,vVar4,vVar5,*pvVar7);
    }
  }
  return;
}

Assistant:

void HModel::util_reportColVecSol(int ncol, vector<double>& XcolCost, vector<double>& XcolLower, vector<double>& XcolUpper,
			      vector<double>& XcolPrimal, vector<double>& XcolDual, vector<int>& XcolStatus) {
  // Report the LP column data and solution passed to the method,
  // where XcolStatus is the SCIP-like basis status
  if (ncol <= 0) return;
  printf("Col    St      Primal       Lower       Upper        Dual        Cost\n");
  for (int col = 0; col < ncol; col++) {
    if (XcolStatus[col] == HSOL_BASESTAT_BASIC)
      printf("%6d BC", col);
    else if (XcolStatus[col] == HSOL_BASESTAT_ZERO)
      printf("%6d FR", col);
    else if (XcolStatus[col] == HSOL_BASESTAT_LOWER) {
      if (XcolLower[col] == XcolUpper[col])
	printf("%6d FX", col);
      else
	printf("%6d LB", col);
    }
    else if (XcolStatus[col] == HSOL_BASESTAT_UPPER)
      printf("%6d UB", col);
    else
      printf("%6d ??", col);
    printf(" %11g %11g %11g %11g %11g\n", XcolPrimal[col], XcolLower[col], XcolUpper[col], XcolDual[col], XcolCost[col]);
  }
}